

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnFunction
          (BinaryReaderObjdump *this,Index index,Index sig_index)

{
  mapped_type mVar1;
  bool bVar2;
  size_type sVar3;
  const_pointer pvVar4;
  mapped_type *pmVar5;
  undefined1 local_30 [8];
  string_view name;
  Index sig_index_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  
  name._M_str._0_4_ = sig_index;
  name._M_str._4_4_ = index;
  PrintDetails(this," - func[%u] sig=%u",(ulong)index,(ulong)sig_index);
  _local_30 = BinaryReaderObjdumpBase::GetFunctionName
                        (&this->super_BinaryReaderObjdumpBase,name._M_str._4_4_);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  if (!bVar2) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    PrintDetails(this," <%.*s>",sVar3 & 0xffffffff,pvVar4);
  }
  PrintDetails(this,"\n");
  mVar1 = (Index)name._M_str;
  pmVar5 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_types,
                        (key_type *)((long)&name._M_str + 4));
  *pmVar5 = mVar1;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnFunction(Index index, Index sig_index) {
  PrintDetails(" - func[%" PRIindex "] sig=%" PRIindex, index, sig_index);
  auto name = GetFunctionName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  objdump_state_->function_types[index] = sig_index;
  return Result::Ok;
}